

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t gnu_sparse_01_parse(archive_read *a,tar *tar,char *p)

{
  wchar_t wVar1;
  int64_t size;
  int64_t remaining;
  char *pcVar2;
  size_t char_cnt;
  long offset;
  char cVar3;
  
  offset = -1;
  do {
    char_cnt = 0;
    pcVar2 = p;
    while( true ) {
      cVar3 = *pcVar2;
      if ((cVar3 == '\0') || (cVar3 == ',')) break;
      if ((byte)(cVar3 - 0x3aU) < 0xf6) {
        return L'\xffffffec';
      }
      char_cnt = char_cnt + 1;
      pcVar2 = pcVar2 + 1;
    }
    remaining = tar_atol_base_n(p,char_cnt,L'\n');
    if (offset < 0) {
      if (remaining < 0) {
        return L'\xffffffec';
      }
    }
    else {
      if (remaining < 0) {
        return L'\xffffffec';
      }
      wVar1 = gnu_add_sparse_entry(a,tar,offset,remaining);
      if (wVar1 != L'\0') {
        return L'\xffffffe2';
      }
      cVar3 = *pcVar2;
      remaining = -1;
    }
    p = pcVar2 + 1;
    offset = remaining;
    if (cVar3 == '\0') {
      return L'\0';
    }
  } while( true );
}

Assistant:

static int
gnu_sparse_01_parse(struct archive_read *a, struct tar *tar, const char *p)
{
	const char *e;
	int64_t offset = -1, size = -1;

	for (;;) {
		e = p;
		while (*e != '\0' && *e != ',') {
			if (*e < '0' || *e > '9')
				return (ARCHIVE_WARN);
			e++;
		}
		if (offset < 0) {
			offset = tar_atol10(p, e - p);
			if (offset < 0)
				return (ARCHIVE_WARN);
		} else {
			size = tar_atol10(p, e - p);
			if (size < 0)
				return (ARCHIVE_WARN);
			if (gnu_add_sparse_entry(a, tar, offset, size)
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			offset = -1;
		}
		if (*e == '\0')
			return (ARCHIVE_OK);
		p = e + 1;
	}
}